

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  TestError *this_00;
  ulong *puVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  string function_definition;
  string function_use;
  string verification;
  string iterator_declaration;
  string iteration_loop_start;
  string iteration_loop_end;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *local_e8;
  TestShaderType local_dc;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78[0] = local_68;
  local_e8 = this;
  local_dc = tested_shader_type;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "                               }\n                           }\n                        }\n                    }\n                }\n            }\n        }\n    }\n"
             ,"");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "    for (uint a = 0u; a < 2u; a++)\n    {\n        for (uint b = 0u; b < 2u; b++)\n        {\n            for (uint c = 0u; c < 2u; c++)\n            {\n                for (uint d = 0u; d < 2u; d++)\n                {\n                    for (uint e = 0u; e < 2u; e++)\n                    {\n                        for (uint f = 0u; f < 2u; f++)\n                        {\n                           for (uint g = 0u; g < 2u; g++)\n                           {\n                               for (uint h = 0u; h < 2u; h++)\n                               {\n"
             ,"");
  paVar1 = &local_128.field_2;
  paVar2 = &local_148.field_2;
  lVar9 = 0;
  while( true ) {
    lVar3 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar3 = 0x2238c78;
      lVar4 = supported_variable_types_map._16_8_;
      do {
        if ((int)test_shader_compilation::var_types_set_gl[lVar9] <= *(int *)(lVar4 + 0x20)) {
          lVar3 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 +
                         (ulong)(*(int *)(lVar4 + 0x20) <
                                (int)test_shader_compilation::var_types_set_gl[lVar9]) * 8);
      } while (lVar4 != 0);
    }
    lVar4 = 0x2238c78;
    if ((lVar3 != 0x2238c78) &&
       (lVar4 = lVar3,
       (int)test_shader_compilation::var_types_set_gl[lVar9] < *(int *)(lVar3 + 0x20))) {
      lVar4 = 0x2238c78;
    }
    local_58 = lVar9;
    if (lVar4 == 0x2238c78) break;
    std::operator+(&local_108,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar4 + 200));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
    puVar6 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_128.field_2._M_allocated_capacity = *puVar6;
      local_128.field_2._8_8_ = plVar5[3];
      local_128._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_128.field_2._M_allocated_capacity = *puVar6;
      local_128._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_128._M_string_length = plVar5[1];
    *plVar5 = (long)puVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_128,*(ulong *)(lVar4 + 0xa8));
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    puVar6 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_168.field_2._M_allocated_capacity = *puVar6;
      local_168.field_2._8_8_ = plVar5[3];
    }
    else {
      local_168.field_2._M_allocated_capacity = *puVar6;
      local_168._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_168._M_string_length = plVar5[1];
    *plVar5 = (long)puVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
    local_d8 = &local_c8;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_c8 = *plVar7;
      lStack_c0 = plVar5[3];
    }
    else {
      local_c8 = *plVar7;
      local_d8 = (long *)*plVar5;
    }
    local_d0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    local_168._M_string_length = 0;
    local_168.field_2._M_allocated_capacity =
         local_168.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity =
         local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_replace((ulong)&local_168,0,(char *)0x0,0x1b20184);
    std::__cxx11::string::_M_append((char *)&local_168,*(ulong *)(lVar4 + 0x28));
    std::__cxx11::string::append((char *)&local_168);
    std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_d8);
    std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_98[0]);
    std::operator+(&local_148,
                   "                                   output_array[a][b][c][d][e][f][g][h] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar4 + 0x108));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_188 = &local_178;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_178 = *plVar7;
      lStack_170 = plVar5[3];
    }
    else {
      local_178 = *plVar7;
      local_188 = (long *)*plVar5;
    }
    local_180 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_148,"                                   iterator += ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar4 + 200));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_188 = &local_178;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_178 = *plVar7;
      lStack_170 = plVar5[3];
    }
    else {
      local_178 = *plVar7;
      local_188 = (long *)*plVar5;
    }
    local_180 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_78[0]);
    std::__cxx11::string::append((char *)&local_168);
    std::operator+(&local_148,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar4 + 0x28));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_178 = *plVar7;
      lStack_170 = plVar5[3];
      local_188 = &local_178;
    }
    else {
      local_178 = *plVar7;
      local_188 = (long *)*plVar5;
    }
    local_180 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_128);
    std::__cxx11::string::_M_assign((string *)&local_108);
    std::__cxx11::string::append((char *)&local_108);
    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_98[0]);
    std::operator+(&local_50,
                   "                                   if (my_array[a][b][c][d][e][f][g][h] ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar4 + 0xe8));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b8 = &local_a8;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_a8 = *plVar7;
      lStack_a0 = plVar5[3];
    }
    else {
      local_a8 = *plVar7;
      local_b8 = (long *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,*(ulong *)(lVar4 + 200));
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148.field_2._8_8_ = plVar5[3];
      local_148._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar8;
      local_148._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_148._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
    local_188 = &local_178;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_178 = *plVar7;
      lStack_170 = plVar5[3];
    }
    else {
      local_178 = *plVar7;
      local_188 = (long *)*plVar5;
    }
    local_180 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_188);
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_78[0]);
    if (local_dc == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(local_e8,COMPUTE_SHADER_TYPE,&local_168,&local_128,&local_108);
    }
    else {
      execute_draw_test(local_e8,local_dc,&local_168,&local_128,&local_108);
    }
    (*(local_e8->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[5])();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    lVar9 = local_58;
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 0xf) {
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x11cf);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionFunctionCalls1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4 };
	static const size_t num_var_types_es = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT,   VAR_TYPE_FLOAT, VAR_TYPE_IVEC2,
															 VAR_TYPE_IVEC3, VAR_TYPE_IVEC4, VAR_TYPE_VEC2,
															 VAR_TYPE_VEC3,  VAR_TYPE_VEC4,  VAR_TYPE_MAT2,
															 VAR_TYPE_MAT3,  VAR_TYPE_MAT4,  VAR_TYPE_DOUBLE,
															 VAR_TYPE_DMAT2, VAR_TYPE_DMAT3, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string iteration_loop_end = "                               }\n"
										   "                           }\n"
										   "                        }\n"
										   "                    }\n"
										   "                }\n"
										   "            }\n"
										   "        }\n"
										   "    }\n";
	const std::string iteration_loop_start = "    for (uint a = 0u; a < 2u; a++)\n"
											 "    {\n"
											 "        for (uint b = 0u; b < 2u; b++)\n"
											 "        {\n"
											 "            for (uint c = 0u; c < 2u; c++)\n"
											 "            {\n"
											 "                for (uint d = 0u; d < 2u; d++)\n"
											 "                {\n"
											 "                    for (uint e = 0u; e < 2u; e++)\n"
											 "                    {\n"
											 "                        for (uint f = 0u; f < 2u; f++)\n"
											 "                        {\n"
											 "                           for (uint g = 0u; g < 2u; g++)\n"
											 "                           {\n"
											 "                               for (uint h = 0u; h < 2u; h++)\n"
											 "                               {\n";
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;
	const bool					test_compute  = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string iterator_declaration = "    " + var_iterator->second.iterator_type +
											   " iterator = " + var_iterator->second.iterator_initialization + ";\n";

			std::string function_definition;
			std::string function_use;
			std::string verification;

			function_definition = "void my_function(out ";
			function_definition += var_iterator->second.type;
			function_definition += " output_array[2][2][2][2][2][2][2][2]) {\n";
			function_definition += iterator_declaration;
			function_definition += iteration_loop_start;
			function_definition += "                                   output_array[a][b][c][d][e][f][g][h] = " +
								   var_iterator->second.variable_type_initializer1 + ";\n";
			function_definition +=
				"                                   iterator += " + var_iterator->second.iterator_type + "(1);\n";
			function_definition += iteration_loop_end;
			function_definition += "}";

			function_use = "    " + var_iterator->second.type + " my_array[2][2][2][2][2][2][2][2];\n";
			function_use += "    my_function(my_array);";

			verification = iterator_declaration;
			verification += "    float result = 1.0;\n";
			verification += iteration_loop_start;
			verification += "                                   if (my_array[a][b][c][d][e][f][g][h] " +
							var_iterator->second.specific_element +
							" != iterator)\n"
							"                                   {\n"
							"                                       result = 0.0;\n"
							"                                   }\n"
							"                                   iterator += " +
							var_iterator->second.iterator_type + "(1);\n";
			verification += iteration_loop_end;

			if (false == test_compute)
			{
				execute_draw_test(tested_shader_type, function_definition, function_use, verification);
			}
			else
			{
				execute_dispatch_test(tested_shader_type, function_definition, function_use, verification);
			}

			/* Deallocate any resources used. */
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}